

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

void __thiscall BCLog::Logger::DisconnectTestLogger(Logger *this)

{
  list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_> *this_00;
  list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  *this_01;
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    this->m_buffering = true;
    if ((FILE *)this->m_fileout != (FILE *)0x0) {
      fclose((FILE *)this->m_fileout);
    }
    this->m_fileout = (FILE *)0x0;
    this_01 = &this->m_print_callbacks;
    std::__cxx11::
    _List_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
    ::_M_clear(&this_01->
                super__List_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
              );
    (this->m_print_callbacks).
    super__List_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_01;
    (this->m_print_callbacks).
    super__List_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_01;
    (this->m_print_callbacks).
    super__List_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
    ._M_impl._M_node._M_size = 0;
    this->m_max_buffer_memusage = 1000000;
    this_00 = &this->m_msgs_before_open;
    this->m_cur_buffer_memusage = 0;
    this->m_buffer_lines_discarded = 0;
    std::__cxx11::
    _List_base<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::_M_clear
              (&this_00->
                super__List_base<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
              );
    (this->m_msgs_before_open).
    super__List_base<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
    (this->m_msgs_before_open).
    super__List_base<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
    (this->m_msgs_before_open).
    super__List_base<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>.
    _M_impl._M_node._M_size = 0;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__throw_system_error(iVar2);
  }
  __stack_chk_fail();
}

Assistant:

void BCLog::Logger::DisconnectTestLogger()
{
    StdLockGuard scoped_lock(m_cs);
    m_buffering = true;
    if (m_fileout != nullptr) fclose(m_fileout);
    m_fileout = nullptr;
    m_print_callbacks.clear();
    m_max_buffer_memusage = DEFAULT_MAX_LOG_BUFFER;
    m_cur_buffer_memusage = 0;
    m_buffer_lines_discarded = 0;
    m_msgs_before_open.clear();

}